

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readokt.c
# Opt level: O1

void free_okt(IFF_CHUNKED *mod)

{
  void *__ptr;
  long lVar1;
  ulong uVar2;
  
  if (mod != (IFF_CHUNKED *)0x0) {
    if (mod->chunks != (IFF_CHUNK *)0x0) {
      if (mod->chunk_count != 0) {
        lVar1 = 8;
        uVar2 = 0;
        do {
          __ptr = *(void **)((long)&mod->chunks->type + lVar1);
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
          uVar2 = uVar2 + 1;
          lVar1 = lVar1 + 0x18;
        } while (uVar2 < mod->chunk_count);
      }
      free(mod->chunks);
    }
    free(mod);
    return;
  }
  return;
}

Assistant:

void free_okt(IFF_CHUNKED * mod)
{
	unsigned i;
	if (mod)
	{
		if (mod->chunks)
		{
			for (i = 0; i < mod->chunk_count; i++)
			{
				if (mod->chunks[i].data) free(mod->chunks[i].data);
			}
			free(mod->chunks);
		}
		free(mod);
	}
}